

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wb_tree.c
# Opt level: O0

dict_remove_result *
wb_tree_remove(dict_remove_result *__return_storage_ptr__,wb_tree *tree,void *key)

{
  wb_node *node_00;
  wb_node *node;
  void *key_local;
  wb_tree *tree_local;
  
  node_00 = (wb_node *)tree_search_node(tree,key);
  if (node_00 == (wb_node *)0x0) {
    memset(__return_storage_ptr__,0,0x18);
  }
  else {
    __return_storage_ptr__->key = node_00->key;
    __return_storage_ptr__->datum = node_00->datum;
    __return_storage_ptr__->removed = true;
    remove_node(tree,node_00);
  }
  return __return_storage_ptr__;
}

Assistant:

dict_remove_result
wb_tree_remove(wb_tree* tree, const void* key)
{
    wb_node* node = tree_search_node(tree, key);
    if (!node)
	return (dict_remove_result) { NULL, NULL, false };
    dict_remove_result result = { node->key, node->datum, true };
    remove_node(tree, node);
    return result;
}